

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int nghttp2_hd_deflate_init(nghttp2_hd_deflater *deflater,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_mem *mem_local;
  nghttp2_hd_deflater *deflater_local;
  
  iVar1 = nghttp2_hd_deflate_init2(deflater,0x1000,mem);
  return iVar1;
}

Assistant:

int nghttp2_hd_deflate_init(nghttp2_hd_deflater *deflater, nghttp2_mem *mem) {
  return nghttp2_hd_deflate_init2(
      deflater, NGHTTP2_HD_DEFAULT_MAX_DEFLATE_BUFFER_SIZE, mem);
}